

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O2

void Seg_ManComputeDelay(Gia_Man_t *pGia,int DelayInit,int nFanouts,int fTwo,int fVerbose)

{
  sat_solver *psVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Seg_Man_t *p;
  Gia_Obj_t *pGVar6;
  abctime aVar7;
  ulong uVar8;
  abctime time;
  abctime time_00;
  int iVar9;
  ulong uVar10;
  char *pStr;
  char *pcVar11;
  uint uVar12;
  int Count;
  uint uVar13;
  long lVar14;
  uint local_50;
  Vec_Int_t *vEdges2;
  abctime local_40;
  Vec_Int_t *local_38;
  
  local_40 = Abc_Clock();
  vEdges2 = (Vec_Int_t *)0x0;
  p = Seg_ManAlloc(pGia,nFanouts);
  local_50 = DelayInit;
  if (DelayInit == 0) {
    local_50 = p->DelayMax;
  }
  if (fVerbose != 0) {
    sat_solver_nvars(p->pSat);
    printf("Running SatEdge with starting delay %d and edge %d (edge vars %d, total vars %d)\n",
           (ulong)local_50,(ulong)(fTwo + 1));
  }
  Seg_ManCreateCnf(p,fTwo,fVerbose);
  sat_solver_set_resource_limits(p->pSat,0,0,0,0);
  psVar1 = p->pSat;
  psVar1->nRuntimeLimit = 0;
  psVar1->fNotUseRandom = 1;
  piVar2 = p->vPolars->pArray;
  uVar12 = p->vPolars->nSize;
  for (lVar14 = 0; lVar14 < psVar1->size; lVar14 = lVar14 + 1) {
    psVar1->polarity[lVar14] = '\0';
  }
  uVar10 = 0;
  uVar8 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar8 = uVar10;
  }
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    psVar1->polarity[piVar2[uVar10]] = '\x01';
  }
  uVar12 = p->DelayMax;
  local_38 = (Vec_Int_t *)0x0;
  do {
    if ((int)uVar12 < 0) {
LAB_00628f22:
      Gia_ManEdgeFromArray(p->pGia,local_38);
      Vec_IntFreeP(&vEdges2);
      Seg_ManStop(p);
      return;
    }
    iVar9 = 0;
    while( true ) {
      iVar3 = p->pGia->vCos->nSize;
      if (iVar3 <= iVar9) break;
      pGVar6 = Gia_ManCo(p->pGia,iVar9);
      iVar3 = Gia_ObjId(p->pGia,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff));
      iVar4 = Vec_IntEntry(p->vFirsts,iVar3);
      iVar3 = Vec_IntEntry(p->vNvars,iVar3);
      if ((int)uVar12 < iVar3) {
        psVar1 = p->pSat;
        iVar3 = Abc_Var2Lit(iVar4 + uVar12,1);
        iVar3 = sat_solver_push(psVar1,iVar3);
        if (iVar3 == 0) {
          iVar3 = p->pGia->vCos->nSize;
          break;
        }
      }
      iVar9 = iVar9 + 1;
    }
    if (iVar9 < iVar3) {
      pcVar11 = "Proved UNSAT for delay %d.  ";
LAB_00628f06:
      pStr = (char *)(ulong)uVar12;
      printf(pcVar11);
      aVar7 = Abc_Clock();
      Abc_PrintTime((int)aVar7 - (int)local_40,pStr,time_00);
      goto LAB_00628f22;
    }
    if ((int)uVar12 <= (int)local_50) {
      iVar9 = sat_solver_nconflicts(p->pSat);
      iVar3 = sat_solver_solve_internal(p->pSat);
      iVar4 = sat_solver_nconflicts(p->pSat);
      if (iVar3 != 1) {
        if (fVerbose != 0) {
          pcVar11 = "Resource limit reached for delay %d.  ";
          if (iVar3 == -1) {
            pcVar11 = "Proved UNSAT for delay %d.  ";
          }
          goto LAB_00628f06;
        }
        goto LAB_00628f22;
      }
      if (fVerbose != 0) {
        uVar13 = 0;
        for (iVar3 = 0; iVar3 < p->nVars; iVar3 = iVar3 + 1) {
          iVar5 = sat_solver_var_value(p->pSat,iVar3);
          uVar13 = uVar13 + iVar5;
        }
        pcVar11 = (char *)(ulong)uVar12;
        printf("Solution with delay %2d and %5d edges exists. Conf = %8d.  ",pcVar11,(ulong)uVar13,
               (ulong)(uint)(iVar4 - iVar9));
        aVar7 = Abc_Clock();
        Abc_PrintTime((int)aVar7 - (int)local_40,pcVar11,time);
      }
      Vec_IntFreeP(&vEdges2);
      vEdges2 = Seg_ManConvertResult(p);
      local_38 = vEdges2;
    }
    uVar12 = uVar12 - 1;
  } while( true );
}

Assistant:

void Seg_ManComputeDelay( Gia_Man_t * pGia, int DelayInit, int nFanouts, int fTwo, int fVerbose )
{
    int nBTLimit = 0;
    int nTimeOut = 0;
    int fVeryVerbose = 0;

    Gia_Obj_t * pObj;
    abctime clk = Abc_Clock();
    Vec_Int_t * vEdges2 = NULL;
    int i, iLut, iFirst, nVars, status, Delay, nConfs;
    Seg_Man_t * p = Seg_ManAlloc( pGia, nFanouts );
    int DelayStart = DelayInit ? DelayInit : p->DelayMax;

    if ( fVerbose )
    printf( "Running SatEdge with starting delay %d and edge %d (edge vars %d, total vars %d)\n", 
        DelayStart, fTwo+1, p->FirstVar, sat_solver_nvars(p->pSat) );
    Seg_ManCreateCnf( p, fTwo, fVerbose );
    //Sat_SolverWriteDimacs( p->pSat, "test_edge.cnf", NULL, NULL, 0 );
    // set resource limits
    sat_solver_set_resource_limits( p->pSat, nBTLimit, 0, 0, 0 );
    sat_solver_set_runtime_limit( p->pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    sat_solver_set_random( p->pSat, 1 );
    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolars), Vec_IntSize(p->vPolars) );
    //sat_solver_set_var_activity( p->pSat, NULL, p->nVars );
    // increment delay gradually
    for ( Delay = p->DelayMax; Delay >= 0; Delay-- )
    {
        // we constrain COs, although it would be fine to constrain only POs
        Gia_ManForEachCoDriver( p->pGia, pObj, i )
        {
            iLut   = Gia_ObjId( p->pGia, pObj );
            iFirst = Vec_IntEntry( p->vFirsts, iLut );
            nVars  = Vec_IntEntry( p->vNvars, iLut );
            if ( Delay < nVars && !sat_solver_push(p->pSat, Abc_Var2Lit(iFirst + Delay, 1)) )
                break;
        }
        if ( i < Gia_ManCoNum(p->pGia) )
        {
            printf( "Proved UNSAT for delay %d.  ", Delay );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            break;
        }
        if ( Delay > DelayStart )
            continue;
        // solve with assumptions
        //clk = Abc_Clock();
        nConfs = sat_solver_nconflicts( p->pSat );
        status = sat_solver_solve_internal( p->pSat );
        nConfs = sat_solver_nconflicts( p->pSat ) - nConfs;
        if ( status == l_True )
        {
            if ( fVerbose )
            {
                int Count = 0;
                for ( i = 0; i < p->nVars; i++ )
                    Count += sat_solver_var_value(p->pSat, i);
                printf( "Solution with delay %2d and %5d edges exists. Conf = %8d.  ", Delay, Count, nConfs );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            // save the result
            Vec_IntFreeP( &vEdges2 );
            vEdges2 = Seg_ManConvertResult( p );
            if ( fVeryVerbose )
            {
                for ( i = 0; i < p->nVars; i++ )
                    printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                printf( "   " );

                for ( i = p->nVars; i < sat_solver_nvars(p->pSat); i++ )
                    printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
            }
        }
        else
        {
            if ( fVerbose )
            {
                if ( status == l_False )
                    printf( "Proved UNSAT for delay %d.  ", Delay );
                else
                    printf( "Resource limit reached for delay %d.  ", Delay );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            break;
        }
    }
    Gia_ManEdgeFromArray( p->pGia, vEdges2 );
    Vec_IntFreeP( &vEdges2 );
    Seg_ManStop( p );
}